

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool range_contains(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  gravity_class_t *pgVar2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_class_t *pgVar4;
  gravity_value_t value;
  char _buffer [4096];
  char acStack_1028 [4096];
  
  pgVar2 = gravity_class_int;
  pgVar1 = args[1].isa;
  if (pgVar1 == gravity_class_int) {
    pgVar4 = gravity_class_bool;
    if (args[1].field_1.n < (long)((args->field_1).p)->objclass) {
      aVar3.n = 0;
    }
    else {
      aVar3.n._1_7_ = 0;
      aVar3.n._0_1_ = args[1].field_1.n <= (long)((args->field_1).p)->identifier;
    }
  }
  else {
    builtin_strncpy(acStack_1028 + 0x10,"is expected.",0xd);
    builtin_strncpy(acStack_1028,"A numeric value ",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,acStack_1028);
    aVar3.n = 0;
    pgVar4 = gravity_class_null;
  }
  value.field_1.n = aVar3.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return pgVar1 == pgVar2;
}

Assistant:

static bool range_contains (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_range_t *range = VALUE_AS_RANGE(GET_VALUE(0));
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("A numeric value is expected.");

    RETURN_VALUE(VALUE_FROM_BOOL((value.n >= range->from) && (value.n <= range->to)), rindex);
}